

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

bool __thiscall cmFileInstaller::GetTargetTypeFromString(cmFileInstaller *this,string *stype)

{
  cmExecutionStatus *pcVar1;
  int iVar2;
  ostream *poVar3;
  ostringstream e;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  iVar2 = std::__cxx11::string::compare((char *)stype);
  if (iVar2 == 0) {
    *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)stype);
    if (iVar2 == 0) {
      *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 4;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)stype);
      if (iVar2 == 0) {
        *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 5;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)stype);
        if (iVar2 == 0) {
          *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 1;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)stype);
          if (iVar2 == 0) {
            *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 2;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)stype);
            if (iVar2 == 0) {
              *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 3;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)stype);
              if (iVar2 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_190,"Option TYPE given unknown value \"",0x21);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_190,(stype->_M_dataplus)._M_p,
                                    stype->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".",2);
                pcVar1 = (this->super_cmFileCopier).Status;
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
                if (local_1b0 != local_1a0) {
                  operator_delete(local_1b0,local_1a0[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
                std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
                return false;
              }
              *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 6;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFileInstaller::GetTargetTypeFromString(const std::string& stype)
{
  if (stype == "EXECUTABLE") {
    this->InstallType = cmInstallType_EXECUTABLE;
  } else if (stype == "FILE") {
    this->InstallType = cmInstallType_FILES;
  } else if (stype == "PROGRAM") {
    this->InstallType = cmInstallType_PROGRAMS;
  } else if (stype == "STATIC_LIBRARY") {
    this->InstallType = cmInstallType_STATIC_LIBRARY;
  } else if (stype == "SHARED_LIBRARY") {
    this->InstallType = cmInstallType_SHARED_LIBRARY;
  } else if (stype == "MODULE") {
    this->InstallType = cmInstallType_MODULE_LIBRARY;
  } else if (stype == "DIRECTORY") {
    this->InstallType = cmInstallType_DIRECTORY;
  } else {
    std::ostringstream e;
    e << "Option TYPE given unknown value \"" << stype << "\".";
    this->Status.SetError(e.str());
    return false;
  }
  return true;
}